

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth_pbuf.c
# Opt level: O1

void csp_eth_pbuf_free(csp_eth_interface_data_t *ifdata,csp_packet_t *buffer,int buf_free,
                      int *task_woken)

{
  csp_packet_t *pcVar1;
  csp_packet_t *packet;
  csp_packet_s **ppcVar2;
  csp_packet_t *pcVar3;
  
  if (ifdata->pbufs != (csp_packet_t *)0x0) {
    pcVar1 = ifdata->pbufs;
    pcVar3 = (csp_packet_t *)0x0;
    do {
      packet = pcVar1;
      if (packet == buffer) {
        ppcVar2 = &pcVar3->next;
        if (pcVar3 == (csp_packet_t *)0x0) {
          ppcVar2 = &ifdata->pbufs;
        }
        *ppcVar2 = packet->next;
        if (buf_free != 0) {
          if (task_woken == (int *)0x0) {
            csp_buffer_free(packet);
          }
          else {
            csp_buffer_free_isr(packet);
          }
        }
      }
      pcVar1 = packet->next;
      pcVar3 = packet;
    } while (packet->next != (csp_packet_s *)0x0);
  }
  return;
}

Assistant:

void csp_eth_pbuf_free(csp_eth_interface_data_t * ifdata, csp_packet_t * buffer, int buf_free, int * task_woken) {

	csp_packet_t * packet = ifdata->pbufs;
	csp_packet_t * prev = NULL;

	while (packet) {

		/* Perform cleanup in used pbufs */
		if (packet == buffer) {

			/* Erase from list prev->next = next */
			if (prev) {
				prev->next = packet->next;
			} else {
				ifdata->pbufs = packet->next;
			}

			if (buf_free) {
				if (task_woken == NULL) {
					csp_buffer_free(packet);
				} else {
					csp_buffer_free_isr(packet);
				}
			}
		}

		prev = packet;
		packet = packet->next;
	}

}